

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

bool P_HitFriend(AActor *self)

{
  bool bVar1;
  AActor *pAVar2;
  double distance;
  DAngle angle;
  FTranslatedLineTarget t;
  undefined1 local_50 [16];
  PClass *local_40;
  FTranslatedLineTarget local_38;
  
  if (((self->flags).Value & 0x8000000) == 0) {
    return false;
  }
  pAVar2 = (self->target).field_0.p;
  if (pAVar2 == (AActor *)0x0) {
    return false;
  }
  if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return false;
  }
  AActor::AngleTo((AActor *)local_50,self,SUB81(pAVar2,0));
  pAVar2 = (self->target).field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003ef17b;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar2 = (AActor *)0x0;
LAB_003ef17b:
  distance = AActor::Distance2D(self,pAVar2,false);
  local_38.linetarget = (AActor *)local_50._0_8_;
  local_40 = (PClass *)0x0;
  P_AimLineAttack((AActor *)(local_50 + 8),(DAngle *)self,distance,&local_38,
                  &local_38.angleFromSource,(int)&local_40,(AActor *)0x1,(AActor *)0x0);
  if ((AActor *)local_38.angleFromSource.Degrees == (AActor *)0x0) {
    return false;
  }
  pAVar2 = (self->target).field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((AActor *)local_38.angleFromSource.Degrees == pAVar2) {
        return false;
      }
    }
    else {
      (self->target).field_0.p = (AActor *)0x0;
    }
  }
  bVar1 = AActor::IsFriend(self,(AActor *)local_38.angleFromSource.Degrees);
  return bVar1;
}

Assistant:

bool P_HitFriend(AActor * self)
{
	FTranslatedLineTarget t;

	if (self->flags&MF_FRIENDLY && self->target != NULL)
	{
		DAngle angle = self->AngleTo(self->target);
		double dist = self->Distance2D(self->target);
		P_AimLineAttack (self, angle, dist, &t, 0., true);
		if (t.linetarget != NULL && t.linetarget != self->target)
		{
			return self->IsFriend (t.linetarget);
		}
	}
	return false;
}